

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlgorithmBase.cpp
# Opt level: O0

int __thiscall AlgorithmBase::ColourDifference(AlgorithmBase *this,QRgb a,QRgb b)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  __type _Var7;
  __type _Var8;
  __type _Var9;
  int rDiff;
  int gDiff;
  int bDiff;
  QRgb b_local;
  QRgb a_local;
  AlgorithmBase *this_local;
  
  iVar1 = qBlue(a);
  iVar2 = qBlue(b);
  iVar3 = qGreen(a);
  iVar4 = qGreen(b);
  iVar5 = qRed(a);
  iVar6 = qRed(b);
  _Var7 = std::pow<int,int>(iVar1 - iVar2,2);
  _Var8 = std::pow<int,int>(iVar3 - iVar4,2);
  _Var9 = std::pow<int,int>(iVar5 - iVar6,2);
  return (int)(_Var7 + _Var8 + _Var9);
}

Assistant:

int AlgorithmBase::ColourDifference(QRgb a, QRgb b) const
{
    int bDiff = qBlue(a) - qBlue(b);
    int gDiff = qGreen(a) - qGreen(b);
    int rDiff = qRed(a) - qRed(b);

    /*
     * std::pow ensures each difference is positive, and also places an emphasis
     * on minimising the difference accross all colours.
     *
     * MAYBE A greater emphasis could be placed on green as the human eye
     * percieves the most luminosity in the green channel.
     */
    return std::pow(bDiff, 2) + std::pow(gDiff, 2) + std::pow(rDiff, 2);
}